

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O3

void __thiscall edition_unittest::TestOneof2_NestedMessage::Clear(TestOneof2_NestedMessage *this)

{
  RepeatedField<int> *this_00;
  anon_union_40_1_493b367e_for_TestOneof2_NestedMessage_3 aVar1;
  int iVar2;
  bool is_soo;
  
  this_00 = &(this->field_0)._impl_.corge_int_;
  aVar1 = this->field_0;
  if (((undefined1  [40])aVar1 & (undefined1  [40])0x4) != (undefined1  [40])0x0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_00);
  }
  is_soo = ((undefined1  [40])aVar1 & (undefined1  [40])0x4) == (undefined1  [40])0x0;
  google::protobuf::internal::SooRep::size(&this_00->soo_rep_,is_soo);
  iVar2 = google::protobuf::internal::SooRep::size(&this_00->soo_rep_,is_soo);
  if ((iVar2 != 0) &&
     ((undefined1  [16])((undefined1  [16])(this_00->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_00);
  }
  google::protobuf::RepeatedField<int>::set_size
            (this_00,((undefined1  [40])aVar1 & (undefined1  [40])0x4) == (undefined1  [40])0x0,0);
  (this->field_0)._impl_.moo_int_ = 0;
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestOneof2_NestedMessage::Clear() {
// @@protoc_insertion_point(message_clear_start:edition_unittest.TestOneof2.NestedMessage)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.corge_int_.Clear();
  _impl_.moo_int_ = ::int64_t{0};
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}